

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.h
# Opt level: O0

void __thiscall
mjs::function_object::put_prototype_with_attributes
          (function_object *this,object_ptr *p,property_attribute attributes)

{
  bool bVar1;
  property_attribute a;
  value local_60;
  value_representation local_38;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_30;
  property_attribute local_1c;
  object_ptr *poStack_18;
  property_attribute attributes_local;
  object_ptr *p_local;
  function_object *this_local;
  
  local_1c = attributes;
  poStack_18 = p;
  p_local = (object_ptr *)this;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_30,L"prototype");
  a = object::own_property_attributes((object *)this,&local_30);
  bVar1 = is_valid(a);
  if (!bVar1) {
    __assert_fail("is_valid(object::own_property_attributes(L\"prototype\"))",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                  ,0x1d,
                  "void mjs::function_object::put_prototype_with_attributes(const object_ptr &, property_attribute)"
                 );
  }
  value::value(&local_60,poStack_18);
  value_representation::value_representation(&local_38,&local_60);
  (this->prototype_prop_).repr_ = local_38.repr_;
  value::~value(&local_60);
  native_object::update_property_attributes(&this->super_native_object,"prototype",local_1c);
  return;
}

Assistant:

void put_prototype_with_attributes(const object_ptr& p, property_attribute attributes) {
        assert(is_valid(object::own_property_attributes(L"prototype")));
        prototype_prop_ = value_representation{value{p}};
        update_property_attributes("prototype", attributes);
    }